

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O3

void flatbuffers::tests::Offset64SizePrefix(void)

{
  long lVar1;
  bool expval;
  unsigned_long *puVar2;
  uint8_t *puVar3;
  uoffset_t uVar4;
  Offset<flatbuffers::String> off;
  FlatBufferBuilder64 builder;
  FlatBufferBuilderImpl<true> local_e8;
  VerifierTemplate<false> local_68;
  
  local_e8.buf_.allocator_ = (Allocator *)0x0;
  local_e8.buf_.own_allocator_ = false;
  local_e8.buf_.initial_size_ = 0x400;
  local_e8.buf_.max_size_ = 0x7fffffffffffffff;
  local_e8.buf_.buffer_minalign_ = 8;
  local_e8.length_of_64_bit_region_ = 0;
  local_e8.nested = false;
  local_e8.finished = false;
  local_e8.buf_.reserved_ = 0;
  local_e8.buf_.size_ = 0;
  local_e8.buf_.buf_ = (uint8_t *)0x0;
  local_e8.buf_.cur_._0_6_ = 0;
  local_e8.buf_.cur_._6_2_ = 0;
  local_e8.buf_.scratch_._0_6_ = 0;
  local_e8._78_8_ = 0;
  local_e8.minalign_ = 1;
  local_e8.force_defaults_ = false;
  local_e8.dedup_vtables_ = true;
  local_e8.string_pool = (StringOffsetMap *)0x0;
  FlatBufferBuilderImpl<true>::CreateStringImpl(&local_e8,"some near string",0x10);
  off.o = (int)local_e8.buf_.size_ - (int)local_e8.length_of_64_bit_region_;
  FlatBufferBuilderImpl<true>::NotNested(&local_e8);
  local_e8.nested = true;
  uVar4 = (int)local_e8.buf_.size_ - (int)local_e8.length_of_64_bit_region_;
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_e8,0x16,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<LeafStruct_const*,unsigned_long>>
            (&local_e8,0x12,(Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_e8,0xe,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_e8,10,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,unsigned_int>>
            (&local_e8,0x14,
             (Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<LeafStruct_const*,unsigned_int>>
            (&local_e8,0x10,(Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::String>(&local_e8,0xc,off);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::String>
            (&local_e8,8,(Offset64<flatbuffers::String>)0x0);
  FlatBufferBuilderImpl<true>::AddElement<int>(&local_e8,6,0,0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>
            (&local_e8,4,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)0x0);
  uVar4 = FlatBufferBuilderImpl<true>::EndTable(&local_e8,uVar4);
  FlatBufferBuilderImpl<true>::Finish(&local_e8,uVar4,(char *)0x0,true);
  puVar2 = (unsigned_long *)FlatBufferBuilderImpl<true>::GetBufferPointer(&local_e8);
  TestEq<unsigned_long,unsigned_long>
            (*puVar2,local_e8.buf_.size_ - 8,
             "\'GetPrefixedSize<uoffset64_t>(builder.GetBufferPointer())\' != \'builder.GetSize() - sizeof(uoffset64_t)\'"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x163,"");
  local_68.buf_ = FlatBufferBuilderImpl<true>::GetBufferPointer(&local_e8);
  local_68.size_ = local_e8.buf_.size_;
  local_68.opts_.max_depth = 0x40;
  local_68.opts_.max_tables = 1000000;
  local_68.opts_.check_alignment = true;
  local_68.opts_.check_nested_flatbuffers = true;
  local_68.opts_.max_size = 0x7fffffffffffffff;
  local_68.opts_.assert = true;
  local_68.upper_bound_ = 0;
  local_68.depth_ = 0;
  local_68.num_tables_ = 0;
  local_68.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  if (local_e8.buf_.size_ < 0x7fffffffffffffff) {
    if ((local_e8.buf_.size_ < 9) || (local_e8.buf_.size_ < *(long *)local_68.buf_ + 8U)) {
      expval = false;
    }
    else {
      expval = VerifierTemplate<false>::VerifyBufferFromStart<RootTable>(&local_68,(char *)0x0,8);
    }
    TestEq<bool,bool>(expval,true,"\'VerifySizePrefixedRootTableBuffer(verifier)\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                      ,0x16c,"");
    puVar3 = FlatBufferBuilderImpl<true>::GetBufferPointer(&local_e8);
    lVar1 = (ulong)*(uint *)(puVar3 + 8) + 8;
    TestEqStr((char *)(puVar3 + (ulong)*(uint *)(puVar3 + (ulong)*(ushort *)
                                                                  (puVar3 + (lVar1 - *(int *)(puVar3
                                                                                             + (
                                                  ulong)*(uint *)(puVar3 + 8) + 8)) + 0xc) + lVar1)
                                + (ulong)*(ushort *)
                                          (puVar3 + (lVar1 - *(int *)(puVar3 + (ulong)*(uint *)(
                                                  puVar3 + 8) + 8)) + 0xc) + lVar1 + 4),
              "some near string",
              "\'root_table->near_string()->c_str()\' != \'\"some near string\"\'",
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
              ,0x172,"");
    FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl(&local_e8);
    return;
  }
  __assert_fail("size_ < opts.max_size",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/verifier.h"
                ,0x2f,
                "flatbuffers::VerifierTemplate<false>::VerifierTemplate(const uint8_t *const, const size_t, const Options &) [TrackVerifierBufferSize = false]"
               );
}

Assistant:

void Offset64SizePrefix() {
  FlatBufferBuilder64 builder;

  // First serialize a nested buffer.
  const Offset<String> near_string_offset =
      builder.CreateString("some near string");

  // Finish by building the root table by passing in all the offsets.
  const Offset<RootTable> root_table_offset =
      CreateRootTable(builder, 0, 0, 0, 0, near_string_offset, 0);

  // Finish the buffer.
  FinishSizePrefixedRootTableBuffer(builder, root_table_offset);

  TEST_EQ(GetPrefixedSize<uoffset64_t>(builder.GetBufferPointer()),
          builder.GetSize() - sizeof(uoffset64_t));

  Verifier::Options options;
  // Allow the verifier to verify 64-bit buffers.
  options.max_size = FLATBUFFERS_MAX_64_BUFFER_SIZE;
  options.assert = true;

  Verifier verifier(builder.GetBufferPointer(), builder.GetSize(), options);

  TEST_EQ(VerifySizePrefixedRootTableBuffer(verifier), true);

  const RootTable *root_table =
      GetSizePrefixedRootTable(builder.GetBufferPointer());

  // Verify the fields.
  TEST_EQ_STR(root_table->near_string()->c_str(), "some near string");
}